

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void __thiscall
Bitmap::drawBarcode(Bitmap *this,uint32_t y,uint32_t height,uint32_t value,double scale)

{
  byte bVar1;
  uint32_t uVar2;
  int32_t pixel;
  uint uVar3;
  ulong uVar4;
  uint x;
  int iVar5;
  ulong uVar6;
  uint8_t barcode [9];
  byte local_39 [9];
  
  if (height != 0) {
    uVar2 = BarcodeEan8::intToBarcode(value,local_39);
    uVar4 = (ulong)(((double)(&this->width)[this->orientation != Horizontally] * scale) /
                   (double)uVar2);
    x = (&this->width)[this->orientation != Horizontally] - uVar2 * (int)uVar4 >> 1;
    for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      bVar1 = local_39[uVar3 >> 3];
      uVar6 = uVar4 & 0xffffffff;
      while (iVar5 = (int)uVar6, uVar6 = (ulong)(iVar5 - 1), iVar5 != 0) {
        pixel = getPixelIndex(this,x,y);
        setPixelValue(this,pixel,(0x80U >> ((byte)uVar3 & 7) & (uint)bVar1) != 0);
        x = x + 1;
      }
    }
    duplicateLineDown(this,y,height - 1);
  }
  return;
}

Assistant:

void Bitmap::drawBarcode(const uint32_t y, const uint32_t height, const uint32_t value, double scale)
{
   if (height > 0)
   {
      uint8_t barcode[9];
      uint32_t barcodeLength;
      uint32_t scaleFactor;
      uint32_t cursor;
      uint32_t pixel;

      //get encode barcode
      barcodeLength = BarcodeEan8::intToBarcode(value, barcode);

      //calculate a scale factor
      uint32_t width = ((orientation == Orientation::Horizontally) ? this->width : this->height);
      scaleFactor = (uint32_t)((scale * width) / barcodeLength);
      //calculate initial cursor position
      cursor = (width - (scaleFactor * barcodeLength)) / 2;

      //draw one barcode line
      for (uint32_t i = 0; i < barcodeLength; ++i)
      {
         bool value = ((barcode[i/8] & (0x80 >> (i & 7))) != 0); //get respective bit
         for (uint32_t j = 0; j < scaleFactor; ++j)
         {
            pixel = (uint32_t)getPixelIndex(cursor++, y);
            setPixelValue(pixel, value);
         }
      }

      //duplicate that line (height - 1)-times
      duplicateLineDown(y, height - 1);
   }
}